

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O3

int __thiscall
CVmObjStringBuffer::getp_char_at
          (CVmObjStringBuffer *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  vm_obj_id_t vVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  if (getp_char_at(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_char_at();
  }
  iVar3 = CVmObject::get_prop_check_argc(retval,argc,&getp_char_at::desc);
  if (iVar3 == 0) {
    iVar4 = CVmBif::pop_int_val();
    iVar3 = -1;
    if (iVar4 < 0) {
      iVar3 = *(int *)(this->super_CVmObject).ext_;
    }
    uVar5 = iVar3 + iVar4;
    if (((int)uVar5 < 0) || (piVar2 = (int *)(this->super_CVmObject).ext_, *piVar2 <= (int)uVar5)) {
      err_throw(0x7df);
    }
    vVar1 = piVar2[(ulong)uVar5 + 3];
    retval->typ = VM_INT;
    (retval->val).obj = vVar1;
  }
  return 1;
}

Assistant:

int CVmObjStringBuffer::getp_char_at(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(1);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the index and adjust to 0-based or end-based */
    int32_t idx = CVmBif::pop_int_val(vmg0_);
    idx += (idx < 0 ? get_ext()->len : -1);

    /* make sure it's in range */
    if (idx < 0 || idx >= (int32_t)get_ext()->len)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* return the character at the given index, as an integer Unicode code */
    retval->set_int(get_ext()->buf[idx]);

    /* handled */
    return TRUE;
}